

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O0

void findScaleSpaceExtrema
               (vector<extrema,_std::allocator<extrema>_> *KP,
               vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
               *dogScaleSpace,Mat *image,uint *cnt)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint *puVar7;
  bool bVar8;
  int iVar9;
  ulong uVar10;
  const_reference pvVar11;
  size_type sVar12;
  const_reference pvVar13;
  byte *pbVar14;
  const_reference this;
  float *pfVar15;
  float *pfVar16;
  ostream *this_00;
  float fVar17;
  float v0;
  float v4;
  float v1;
  float fVar18;
  float v5;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  __type _Var19;
  pair<double,_int> pVar20;
  double local_210;
  Point_<float> local_208;
  vector<double,_std::allocator<double>_> local_200;
  undefined1 local_1e8 [8];
  vector<double,_std::allocator<double>_> tmpCell;
  uint col_cell;
  uint row_cell;
  vector<double,_std::allocator<double>_> local_1c0;
  float local_1a8;
  float local_1a4;
  float det;
  float tr;
  double edgeThreshold;
  float local_18c;
  undefined1 local_188 [4];
  float t;
  Matx31f dD2;
  Vec3f X;
  Matx33f H;
  float dys;
  float dxs;
  float dxy;
  float dss;
  float dyy;
  float dxx;
  float v2;
  Vec3f dD;
  float contr;
  float xc;
  float xr;
  float xi;
  Mat *next;
  Mat *prev;
  float cross_deriv_scale;
  float second_deriv_scale;
  float deriv_scale;
  float img_scale;
  Point_<float> local_e0;
  const_reference local_d8;
  Mat *img;
  double angle;
  double tangentC;
  double tangentR;
  extrema tmpKp;
  double local_40;
  double val;
  uint c;
  uint r;
  uint j;
  uint i;
  uint *cnt_local;
  Mat *image_local;
  vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
  *dogScaleSpace_local;
  vector<extrema,_std::allocator<extrema>_> *KP_local;
  
  r = 0;
  _j = cnt;
  cnt_local = (uint *)image;
  image_local = (Mat *)dogScaleSpace;
  dogScaleSpace_local =
       (vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
        *)KP;
  do {
    if (3 < r) {
      return;
    }
    c = 1;
    while( true ) {
      uVar10 = (ulong)c;
      pvVar11 = std::
                vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                ::operator[]((vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                              *)image_local,(ulong)r);
      sVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size(pvVar11);
      if (sVar12 - 1 <= uVar10) break;
      val._4_4_ = 5;
      while( true ) {
        uVar6 = val._4_4_;
        pvVar11 = std::
                  vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                  ::operator[]((vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                                *)image_local,(ulong)r);
        pvVar13 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](pvVar11,(ulong)c);
        if (pvVar13->rows - 5U <= uVar6) break;
        val._0_4_ = 5;
        while( true ) {
          uVar6 = val._0_4_;
          pvVar11 = std::
                    vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                    ::operator[]((vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                                  *)image_local,(ulong)r);
          pvVar13 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](pvVar11,(ulong)c);
          if (pvVar13->cols - 5U <= uVar6) break;
          *_j = *_j + 1;
          pvVar11 = std::
                    vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                    ::operator[]((vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                                  *)image_local,(ulong)r);
          pvVar13 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](pvVar11,(ulong)c);
          pbVar14 = cv::Mat::at<unsigned_char>(pvVar13,val._4_4_,val._0_4_);
          local_40 = (double)*pbVar14;
          tmpKp.NeighborCells.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x4022000000000000;
          bVar8 = findExtrema((vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                               *)image_local,&local_40,&r,&c,(uint *)((long)&val + 4),(uint *)&val,
                              (double *)
                              &tmpKp.NeighborCells.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar8) {
            extrema::extrema((extrema *)&tangentR);
            tangentR = (double)r;
            tmpKp.octave._0_4_ = c;
            pvVar11 = std::
                      vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                      ::operator[]((vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                                    *)image_local,(ulong)r);
            local_d8 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](pvVar11,(ulong)c);
            cv::Point_<float>::Point_
                      (&local_e0,
                       ((float)val._0_4_ / (float)local_d8->rows) * (float)(int)cnt_local[2],
                       ((float)val._4_4_ / (float)local_d8->cols) * (float)(int)cnt_local[3]);
            cv::Point_<float>::operator=((Point_<float> *)((long)&tmpKp.octave + 4),&local_e0);
            pvVar11 = std::
                      vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                      ::operator[]((vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                                    *)image_local,(ulong)r);
            pvVar13 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                                (pvVar11,(ulong)(c - 1));
            pvVar11 = std::
                      vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                      ::operator[]((vector<std::vector<cv::Mat,_std::allocator<cv::Mat>_>,_std::allocator<std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
                                    *)image_local,(ulong)r);
            this = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                             (pvVar11,(ulong)(c + 1));
            pbVar14 = cv::Mat::at<unsigned_char>(local_d8,val._4_4_,val._0_4_ + 1);
            bVar1 = *pbVar14;
            pbVar14 = cv::Mat::at<unsigned_char>(local_d8,val._4_4_,val._0_4_ - 1);
            bVar2 = *pbVar14;
            pbVar14 = cv::Mat::at<unsigned_char>(local_d8,val._4_4_ + 1,val._0_4_);
            bVar3 = *pbVar14;
            pbVar14 = cv::Mat::at<unsigned_char>(local_d8,val._4_4_ - 1,val._0_4_);
            bVar4 = *pbVar14;
            pbVar14 = cv::Mat::at<unsigned_char>(this,val._4_4_,val._0_4_);
            bVar5 = *pbVar14;
            pbVar14 = cv::Mat::at<unsigned_char>(pvVar13,val._4_4_,val._0_4_);
            cv::Vec<float,_3>::Vec
                      ((Vec<float,_3> *)&dxx,(float)(int)((uint)bVar1 - (uint)bVar2) * 0.0019607844,
                       (float)(int)((uint)bVar3 - (uint)bVar4) * 0.0019607844,
                       (float)(int)((uint)bVar5 - (uint)*pbVar14) * 0.0019607844);
            pbVar14 = cv::Mat::at<unsigned_char>(local_d8,val._4_4_,val._0_4_);
            fVar17 = (float)*pbVar14 + (float)*pbVar14;
            pbVar14 = cv::Mat::at<unsigned_char>(local_d8,val._4_4_,val._0_4_ + 1);
            bVar1 = *pbVar14;
            pbVar14 = cv::Mat::at<unsigned_char>(local_d8,val._4_4_,val._0_4_ - 1);
            v0 = ((float)((uint)bVar1 + (uint)*pbVar14) - fVar17) * 0.003921569;
            pbVar14 = cv::Mat::at<unsigned_char>(local_d8,val._4_4_ + 1,val._0_4_);
            bVar1 = *pbVar14;
            pbVar14 = cv::Mat::at<unsigned_char>(local_d8,val._4_4_ - 1,val._0_4_);
            v4 = ((float)((uint)bVar1 + (uint)*pbVar14) - fVar17) * 0.003921569;
            pbVar14 = cv::Mat::at<unsigned_char>(this,val._4_4_,val._0_4_);
            bVar1 = *pbVar14;
            pbVar14 = cv::Mat::at<unsigned_char>(pvVar13,val._4_4_,val._0_4_);
            bVar2 = *pbVar14;
            pbVar14 = cv::Mat::at<unsigned_char>(local_d8,val._4_4_ + 1,val._0_4_ + 1);
            bVar3 = *pbVar14;
            pbVar14 = cv::Mat::at<unsigned_char>(local_d8,val._4_4_ + 1,val._0_4_ - 1);
            bVar4 = *pbVar14;
            pbVar14 = cv::Mat::at<unsigned_char>(local_d8,val._4_4_ - 1,val._0_4_ + 1);
            bVar5 = *pbVar14;
            pbVar14 = cv::Mat::at<unsigned_char>(local_d8,val._4_4_ - 1,val._0_4_ - 1);
            v1 = (float)(int)((((uint)bVar3 - (uint)bVar4) - (uint)bVar5) + (uint)*pbVar14) *
                 0.0009803922;
            pbVar14 = cv::Mat::at<unsigned_char>(this,val._4_4_,val._0_4_ + 1);
            bVar3 = *pbVar14;
            pbVar14 = cv::Mat::at<unsigned_char>(this,val._4_4_,val._0_4_ - 1);
            bVar4 = *pbVar14;
            pbVar14 = cv::Mat::at<unsigned_char>(pvVar13,val._4_4_,val._0_4_ + 1);
            bVar5 = *pbVar14;
            pbVar14 = cv::Mat::at<unsigned_char>(pvVar13,val._4_4_,val._0_4_ - 1);
            fVar18 = (float)(int)((((uint)bVar3 - (uint)bVar4) - (uint)bVar5) + (uint)*pbVar14) *
                     0.0009803922;
            pbVar14 = cv::Mat::at<unsigned_char>(this,val._4_4_ + 1,val._0_4_);
            bVar3 = *pbVar14;
            pbVar14 = cv::Mat::at<unsigned_char>(this,val._4_4_ - 1,val._0_4_);
            bVar4 = *pbVar14;
            pbVar14 = cv::Mat::at<unsigned_char>(pvVar13,val._4_4_ + 1,val._0_4_);
            bVar5 = *pbVar14;
            pbVar14 = cv::Mat::at<unsigned_char>(pvVar13,val._4_4_ - 1,val._0_4_);
            v5 = (float)(int)((((uint)bVar3 - (uint)bVar4) - (uint)bVar5) + (uint)*pbVar14) *
                 0.0009803922;
            cv::Matx<float,_3,_3>::Matx
                      ((Matx<float,_3,_3> *)(X.super_Matx<float,_3,_1>.val + 1),v0,v1,fVar18,v1,v4,
                       v5,fVar18,v5,((float)((uint)bVar1 + (uint)bVar2) - fVar17) * 0.003921569);
            cv::Matx<float,_3,_3>::solve
                      ((Matx<float,_3,_3> *)(dD2.val + 2),
                       (Vec<float,_3> *)(X.super_Matx<float,_3,_1>.val + 1),(int)&dxx);
            pfVar15 = cv::Vec<float,_3>::operator[]((Vec<float,_3> *)(dD2.val + 2),2);
            fVar17 = *pfVar15;
            pfVar15 = cv::Vec<float,_3>::operator[]((Vec<float,_3> *)(dD2.val + 2),1);
            fVar18 = *pfVar15;
            pfVar15 = dD2.val + 2;
            pfVar16 = cv::Vec<float,_3>::operator[]((Vec<float,_3> *)pfVar15,0);
            iVar9 = (int)pfVar15;
            dD.super_Matx<float,_3,_1>.val[2] = -*pfVar16;
            std::abs(iVar9);
            if (((0.5 <= extraout_XMM0_Da) || (std::abs(iVar9), 0.5 <= extraout_XMM0_Da_00)) ||
               (std::abs(iVar9), 0.5 <= extraout_XMM0_Da_01)) {
              pbVar14 = cv::Mat::at<unsigned_char>(local_d8,val._4_4_,val._0_4_ + 1);
              bVar1 = *pbVar14;
              pbVar14 = cv::Mat::at<unsigned_char>(local_d8,val._4_4_,val._0_4_ - 1);
              bVar2 = *pbVar14;
              pbVar14 = cv::Mat::at<unsigned_char>(local_d8,val._4_4_ + 1,val._0_4_);
              bVar3 = *pbVar14;
              pbVar14 = cv::Mat::at<unsigned_char>(local_d8,val._4_4_ - 1,val._0_4_);
              bVar4 = *pbVar14;
              pbVar14 = cv::Mat::at<unsigned_char>(this,val._4_4_,val._0_4_);
              bVar5 = *pbVar14;
              pbVar14 = cv::Mat::at<unsigned_char>(pvVar13,val._4_4_,val._0_4_);
              cv::Matx<float,_3,_1>::Matx
                        ((Matx<float,_3,_1> *)local_188,
                         (float)(int)((uint)bVar1 - (uint)bVar2) * 0.0019607844,
                         (float)(int)((uint)bVar3 - (uint)bVar4) * 0.0019607844,
                         (float)(int)((uint)bVar5 - (uint)*pbVar14) * 0.0019607844);
              cv::Matx<float,_3,_1>::Matx
                        ((Matx<float,_3,_1> *)&edgeThreshold,dD.super_Matx<float,_3,_1>.val[2],
                         -fVar18,-fVar17);
              local_18c = cv::Matx<float,_3,_1>::dot
                                    ((Matx<float,_3,_1> *)local_188,
                                     (Matx<float,_3,_1> *)&edgeThreshold);
              pvVar13 = local_d8;
              pbVar14 = cv::Mat::at<unsigned_char>(local_d8,val._4_4_,val._0_4_);
              iVar9 = (int)pvVar13;
              dD.super_Matx<float,_3,_1>.val[1] = (float)*pbVar14 * 0.003921569 + local_18c * 0.5;
              std::abs(iVar9);
              if (0.03 <= extraout_XMM0_Da_02 * 5.0) {
                std::abs(iVar9);
                this_00 = (ostream *)
                          std::ostream::operator<<((ostream *)&std::cout,extraout_XMM0_Da_03 * 5.0);
                std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
                _det = 0x4024000000000000;
                local_1a4 = v0 + v4;
                local_1a8 = v0 * v4 + -(v1 * v1);
                if ((local_1a8 <= 0.0) || (local_1a8 * 121.0 <= local_1a4 * local_1a4 * 10.0)) {
                  dD2.val[1] = 1.54143e-44;
                }
                else {
                  iVar9 = cvRound(dD.super_Matx<float,_3,_1>.val[2]);
                  tmpKp.octave._4_4_ = tmpKp.octave._4_4_ + (float)iVar9;
                  iVar9 = cvRound(-fVar18);
                  tmpKp.layer = (int)((float)tmpKp.layer + (float)iVar9);
                  std::vector<double,_std::allocator<double>_>::resize
                            ((vector<double,_std::allocator<double>_> *)&tmpKp.magnitude,0x24);
                  std::vector<double,_std::allocator<double>_>::resize
                            ((vector<double,_std::allocator<double>_> *)
                             &tmpKp.keypoint_bin.super__Vector_base<double,_std::allocator<double>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,8);
                  pbVar14 = cv::Mat::at<unsigned_char>
                                      ((Mat *)cnt_local,(int)(float)tmpKp.layer,
                                       (int)(tmpKp.octave._4_4_ + 1.0));
                  bVar1 = *pbVar14;
                  pbVar14 = cv::Mat::at<unsigned_char>
                                      ((Mat *)cnt_local,(int)(float)tmpKp.layer,
                                       (int)(tmpKp.octave._4_4_ + -1.0));
                  angle = (double)bVar1 - (double)*pbVar14;
                  pbVar14 = cv::Mat::at<unsigned_char>
                                      ((Mat *)cnt_local,(int)((float)tmpKp.layer + 1.0),
                                       (int)tmpKp.octave._4_4_);
                  bVar1 = *pbVar14;
                  pbVar14 = cv::Mat::at<unsigned_char>
                                      ((Mat *)cnt_local,(int)((float)tmpKp.layer + -1.0),
                                       (int)tmpKp.octave._4_4_);
                  tangentC = (double)bVar1 - (double)*pbVar14;
                  img = (Mat *)calAngle(angle,tangentC);
                  tmpKp._16_8_ = img;
                  tmpKp.angle = pow(angle * angle + tangentC * tangentC,0.5);
                  puVar7 = cnt_local;
                  _Var19 = std::pow<int,double>
                                     (2,(double)(int)(tmpKp.octave._0_4_ - 1) * 0.5 + tangentR);
                  _col_cell = _Var19 * 1.5;
                  keypoint_Orientation
                            (&local_1c0,(Mat *)puVar7,(Point2f *)((long)&tmpKp.octave + 4),
                             (double *)&col_cell);
                  std::vector<double,_std::allocator<double>_>::operator=
                            ((vector<double,_std::allocator<double>_> *)&tmpKp.magnitude,&local_1c0)
                  ;
                  std::vector<double,_std::allocator<double>_>::~vector(&local_1c0);
                  for (tmpCell.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                      tmpCell.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_ < 4;
                      tmpCell.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_ =
                           tmpCell.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
                    for (tmpCell.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                        (uint)tmpCell.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage < 4;
                        tmpCell.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._0_4_ =
                             (uint)tmpCell.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
                      std::vector<double,_std::allocator<double>_>::vector
                                ((vector<double,_std::allocator<double>_> *)local_1e8);
                      puVar7 = cnt_local;
                      cv::Point_<float>::Point_
                                (&local_208,
                                 (tmpKp.octave._4_4_ +
                                 (float)((uint)tmpCell.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage <<
                                        2)) - 7.0,
                                 ((float)tmpKp.layer +
                                 (float)(tmpCell.super__Vector_base<double,_std::allocator<double>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <<
                                        2)) - 7.0);
                      pVar20 = Max((vector<double,_std::allocator<double>_> *)&tmpKp.magnitude);
                      local_210 = (double)(pVar20.second * 10);
                      calcOrientationHist(&local_200,(Mat *)puVar7,&local_208,
                                          (Point2f *)((long)&tmpKp.octave + 4),&local_210);
                      std::vector<double,_std::allocator<double>_>::operator=
                                ((vector<double,_std::allocator<double>_> *)local_1e8,&local_200);
                      std::vector<double,_std::allocator<double>_>::~vector(&local_200);
                      std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   *)&tmpKp.cell_bin.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage,
                                  (vector<double,_std::allocator<double>_> *)local_1e8);
                      std::vector<double,_std::allocator<double>_>::~vector
                                ((vector<double,_std::allocator<double>_> *)local_1e8);
                    }
                  }
                  std::vector<extrema,_std::allocator<extrema>_>::push_back
                            ((vector<extrema,_std::allocator<extrema>_> *)dogScaleSpace_local,
                             (value_type *)&tangentR);
                  dD2.val[1] = 0.0;
                }
              }
              else {
                dD2.val[1] = 1.54143e-44;
              }
            }
            else {
              dD2.val[1] = 1.54143e-44;
            }
            extrema::~extrema((extrema *)&tangentR);
            if (dD2.val[1] != 0.0) break;
          }
          val._0_4_ = val._0_4_ + 1;
        }
        val._4_4_ = val._4_4_ + 1;
      }
      c = c + 1;
    }
    r = r + 1;
  } while( true );
}

Assistant:

void findScaleSpaceExtrema(vector<extrema>& KP, const vector<vector<Mat> >& dogScaleSpace, const Mat& image, unsigned& cnt){
    for(unsigned i = 0; i < octave; i++){
        for(unsigned j = 1; j < dogScaleSpace[i].size()-1; j++){
            for(unsigned r = border; r < dogScaleSpace[i][j].rows-border; r++){
                for(unsigned c = border; c < dogScaleSpace[i][j].cols-border; c++){
                    cnt ++;
                    double val = (double)dogScaleSpace[i][j].at<uchar>(r,c);
                    if( findExtrema(dogScaleSpace, val, i, j, r, c, thres)){
                        extrema tmpKp;
                        double tangentR, tangentC, angle;
                        tmpKp.octave = i;
                        tmpKp.layer = j;
                        const Mat& img = dogScaleSpace[i][j];
                        // tmpKp.pt.y = r / (double)img.cols * (double)image.cols;
                        // tmpKp.pt.x = c / (double)img.rows * (double)image.rows;
                        tmpKp.pt = Point2f (c / (double)img.rows * (double)image.rows, r / (double)img.cols * (double)image.cols);

////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
                        const float img_scale = 1.f/(255);
                        const float deriv_scale = img_scale*0.5f;
                        const float second_deriv_scale = img_scale;
                        const float cross_deriv_scale = img_scale*0.25f;

                        const Mat& prev = dogScaleSpace[i][j-1];
                        const Mat& next = dogScaleSpace[i][j+1];
                        float xi, xr, xc, contr;

                        Vec3f dD((img.at<uchar>(r, c+1) - img.at<uchar>(r, c-1))*deriv_scale,
                                (img.at<uchar>(r+1, c) - img.at<uchar>(r-1, c))*deriv_scale,
                                (next.at<uchar>(r, c) - prev.at<uchar>(r, c))*deriv_scale);
                        
                        float v2 = (float)img.at<uchar>(r, c)*2;
                        float dxx = (img.at<uchar>(r, c+1) + img.at<uchar>(r, c-1) - v2)*second_deriv_scale;
                        float dyy = (img.at<uchar>(r+1, c) + img.at<uchar>(r-1, c) - v2)*second_deriv_scale;
                        float dss = (next.at<uchar>(r, c) + prev.at<uchar>(r, c) - v2)*second_deriv_scale;
                        float dxy = (img.at<uchar>(r+1, c+1) - img.at<uchar>(r+1, c-1) -
                                    img.at<uchar>(r-1, c+1) + img.at<uchar>(r-1, c-1))*cross_deriv_scale;
                        float dxs = (next.at<uchar>(r, c+1) - next.at<uchar>(r, c-1) -
                                    prev.at<uchar>(r, c+1) + prev.at<uchar>(r, c-1))*cross_deriv_scale;
                        float dys = (next.at<uchar>(r+1, c) - next.at<uchar>(r-1, c) -
                                    prev.at<uchar>(r+1, c) + prev.at<uchar>(r-1, c))*cross_deriv_scale;
                        
                        Matx33f H(dxx, dxy, dxs,
                                  dxy, dyy, dys,
                                  dxs, dys, dss);

                        Vec3f X = H.solve(dD, DECOMP_LU);

                        xi = -X[2];
                        xr = -X[1];
                        xc = -X[0];

                        if( std::abs(xi) < 0.5f && std::abs(xr) < 0.5f && std::abs(xc) < 0.5f )
                            break;
                        
                        Matx31f dD2((img.at<uchar>(r, c+1) - img.at<uchar>(r, c-1))*deriv_scale,
                                   (img.at<uchar>(r+1, c) - img.at<uchar>(r-1, c))*deriv_scale,
                                   (next.at<uchar>(r, c) - prev.at<uchar>(r, c))*deriv_scale);
                        float t = dD2.dot(Matx31f(xc, xr, xi));
                        contr = img.at<uchar>(r,c)*img_scale + t*0.5f;
                        if( abs( contr ) * octaveLayer < 0.03 )
                            break;
                        cout << abs( contr ) * octaveLayer << endl;
                        
                        double edgeThreshold = 10.0;
                        float tr = dxx + dyy;
                        float det = dxx * dyy - dxy * dxy;
                        if( det <= 0 || tr*tr*edgeThreshold >= (edgeThreshold + 1)*(edgeThreshold + 1)*det )
                            break;

                        // cout << xi << "  "<< xr << "  "<< xc <<endl;
                        // if(std::abs(xi) > 1 || std::abs(xr) > 1 || std::abs(xc) < 1)
                        //     break;
                        tmpKp.pt.x += cvRound(xc);
                        tmpKp.pt.y += cvRound(xr);
////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
                        tmpKp.keypoint_bin.resize(36);
                        tmpKp.cell_bin.resize(8);
                        tangentC = (double)image.at<uchar>(tmpKp.pt.y, tmpKp.pt.x+1) - (double)image.at<uchar>(tmpKp.pt.y, tmpKp.pt.x-1);
                        tangentR = (double)image.at<uchar>(tmpKp.pt.y+1, tmpKp.pt.x) - (double)image.at<uchar>(tmpKp.pt.y-1, tmpKp.pt.x);
                        angle = calAngle(tangentC, tangentR);
                        tmpKp.angle = angle;
                        tmpKp.magnitude = pow(tangentC * tangentC + tangentR * tangentR, 0.5);
                        tmpKp.keypoint_bin = keypoint_Orientation(image, tmpKp.pt, 1.5 * pow(2,(tmpKp.layer-1)/2.0 + tmpKp.octave));

                        for(unsigned row_cell = 0; row_cell < block_width; row_cell++){
                            for(unsigned col_cell = 0; col_cell < block_width; col_cell++){
                                vector<double> tmpCell;
                                tmpCell = calcOrientationHist(image, Point2f(tmpKp.pt.x + col_cell*block_width - 7, tmpKp.pt.y + row_cell*block_width - 7),
                                                                tmpKp.pt, Max(tmpKp.keypoint_bin).second * 10);
                                tmpKp.NeighborCells.push_back(tmpCell);
                            }
                        }
                        KP.push_back(tmpKp);
                    }
                }
            }
        }
    }
}